

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

void __thiscall dynamicgraph::SignalPtr<double,int>::checkCompatibility(SignalPtr<double,int> *this)

{
  SignalPtr<double,_int>::checkCompatibility
            ((SignalPtr<double,_int> *)(this + *(long *)(*(long *)this + -200)));
  return;
}

Assistant:

void SignalPtr<T, Time>::checkCompatibility() {
  if (isPlugged() && (!autoref())) {
    getPtr()->checkCompatibility();
  } else if (isAbstractPluged() && (!autoref())) {
    abstractTransmitter->checkCompatibility();
  } else
    Signal<T, Time>::checkCompatibility();
}